

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O3

void __thiscall
trng::correlated_normal_dist<double>::param_type::param_type<double_const*>
          (param_type *this,double *first,double *last)

{
  iterator __position;
  size_type sVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = (double)((long)last - (long)first >> 3);
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  uVar2 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
  this->d_ = uVar2;
  std::vector<double,_std::allocator<double>_>::reserve(&this->H_,uVar2 * uVar2);
  sVar1 = this->d_;
  if (sVar1 * sVar1 != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      __position._M_current =
           (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)this,__position,
                   (double *)((long)first + lVar3));
        sVar1 = this->d_;
      }
      else {
        *__position._M_current = first[uVar2];
        (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar2 < sVar1 * sVar1);
  }
  Cholesky_factorization(this);
  return;
}

Assistant:

explicit param_type(iter first, iter last) {
        d_ = static_cast<size_type>(
            trng::math::sqrt(static_cast<result_type>(std::distance(first, last))));
        H_.reserve(d_ * d_);
        for (size_type i{0}; i < d_ * d_; ++i, ++first)
          H_.push_back(*first);
        Cholesky_factorization();
      }